

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spxdantzigpr.hpp
# Opt level: O2

int __thiscall soplex::SPxDantzigPR<double>::selectLeaveSparse(SPxDantzigPR<double> *this)

{
  double dVar1;
  int iVar2;
  int iVar3;
  SPxSolverBase<double> *pSVar4;
  int *piVar5;
  int iVar6;
  ulong uVar7;
  ulong uVar8;
  double dVar9;
  double dVar10;
  
  dVar9 = -(this->super_SPxPricer<double>).thetolerance;
  pSVar4 = (this->super_SPxPricer<double>).thesolver;
  uVar7 = (ulong)(uint)(pSVar4->infeasibilities).super_IdxSet.num;
  dVar1 = dVar9;
  iVar2 = -1;
LAB_001ce9fe:
  iVar6 = iVar2;
  dVar10 = dVar1;
  uVar8 = uVar7 & 0xffffffff;
  do {
    uVar7 = uVar7 - 1;
    if ((int)uVar8 < 1) {
      return iVar6;
    }
    piVar5 = (pSVar4->infeasibilities).super_IdxSet.idx;
    iVar2 = piVar5[uVar7];
    dVar1 = (pSVar4->theCoTest).val.super__Vector_base<double,_std::allocator<double>_>._M_impl.
            super__Vector_impl_data._M_start[iVar2];
    if (dVar9 <= dVar1) {
      iVar3 = (pSVar4->infeasibilities).super_IdxSet.num;
      (pSVar4->infeasibilities).super_IdxSet.num = iVar3 + -1;
      piVar5[uVar7] = piVar5[(long)iVar3 + -1];
      (pSVar4->isInfeasible).data[iVar2] = 0;
    }
    else if (dVar1 < dVar10) goto LAB_001ce9fe;
    uVar8 = (ulong)((int)uVar8 - 1);
  } while( true );
}

Assistant:

int SPxDantzigPR<R>::selectLeaveSparse()
{
   assert(this->thesolver != nullptr);

   R best   = -this->thetolerance;
   R x;
   int  n      = -1;
   int  index;

   for(int i = this->thesolver->infeasibilities.size() - 1; i >= 0; --i)
   {
      index = this->thesolver->infeasibilities.index(i);
      x = this->thesolver->fTest()[index];

      if(x < -this->thetolerance)
      {
         if(x < best)
         {
            n    = index;
            best = x;
         }
      }
      else
      {
         this->thesolver->infeasibilities.remove(i);
         assert(this->thesolver->isInfeasible[index] > 0);
         this->thesolver->isInfeasible[index] = 0;
      }
   }

   return n;
}